

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

int __thiscall QIODevice::open(QIODevice *this,char *__file,int __oflag,...)

{
  QIODevicePrivate *this_00;
  QArrayData *data;
  int iVar1;
  qint64 qVar2;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar3;
  long lVar4;
  QArrayDataPointer<QRingChunk> *pQVar5;
  
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = (Int)__file;
  if (((ulong)__file & 4) == 0) {
    qVar2 = 0;
  }
  else {
    iVar1 = (*this->_vptr_QIODevice[6])(this,__file,___oflag);
    qVar2 = CONCAT44(extraout_var,iVar1);
  }
  this_00->pos = qVar2;
  this_00->accessMode = Unset;
  lVar4 = (this_00->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (0 < lVar4) {
    pQVar5 = (QArrayDataPointer<QRingChunk> *)
             (this_00->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
    lVar4 = lVar4 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar5);
      pQVar5 = (QArrayDataPointer<QRingChunk> *)&pQVar5[1].size;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  (this_00->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s = 0;
  lVar4 = (this_00->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  if (0 < lVar4) {
    pQVar5 = (QArrayDataPointer<QRingChunk> *)
             (this_00->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr;
    lVar4 = lVar4 + 1;
    do {
      QArrayDataPointer<QRingChunk>::~QArrayDataPointer(pQVar5);
      pQVar5 = (QArrayDataPointer<QRingChunk> *)&pQVar5[1].size;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  (this_00->writeBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s = 0;
  QIODevicePrivate::setReadChannelCount
            (this_00,(Int)(((this->d_ptr)._M_t.
                            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>
                            .super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl)->
                          openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                          super_QFlagsStorage<QIODeviceBase::OpenModeFlag> & 1);
  QIODevicePrivate::setWriteChannelCount
            (this_00,(Int)(((this->d_ptr)._M_t.
                            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>
                            .super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl)->
                          openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                          super_QFlagsStorage<QIODeviceBase::OpenModeFlag> >> 1 & 1);
  uVar3 = extraout_RAX;
  if ((this_00->errorString).d.ptr != (char16_t *)0x0) {
    data = &((this_00->errorString).d.d)->super_QArrayData;
    (this_00->errorString).d.d = (Data *)0x0;
    (this_00->errorString).d.ptr = (char16_t *)0x0;
    (this_00->errorString).d.size = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
        uVar3 = extraout_RAX_00;
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),1);
}

Assistant:

bool QIODevice::open(QIODeviceBase::OpenMode mode)
{
    Q_D(QIODevice);
    d->openMode = mode;
    d->pos = (mode & Append) ? size() : qint64(0);
    d->accessMode = QIODevicePrivate::Unset;
    d->readBuffers.clear();
    d->writeBuffers.clear();
    d->setReadChannelCount(isReadable() ? 1 : 0);
    d->setWriteChannelCount(isWritable() ? 1 : 0);
    d->errorString.clear();
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::open(0x%x)\n", this, mode.toInt());
#endif
    return true;
}